

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_exponent_sign_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  bool local_1a;
  bool match;
  char c_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  local_1a = true;
  number_is_float(this);
  matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,9);
  if (c == '+') {
    (this->fp_acc_).exp_is_negative = false;
  }
  else if (c == '-') {
    (this->fp_acc_).exp_is_negative = true;
  }
  else {
    local_1a = do_exponent_digit_state(this,parser,c);
  }
  return local_1a;
}

Assistant:

bool number_matcher<Callbacks>::do_exponent_sign_state (parser<Callbacks> & parser,
                                                                    char c) {
                bool match = true;
                this->number_is_float ();
                this->set_state (exponent_initial_digit_state);
                switch (c) {
                case '+': fp_acc_.exp_is_negative = false; break;
                case '-': fp_acc_.exp_is_negative = true; break;
                default: match = this->do_exponent_digit_state (parser, c); break;
                }
                return match;
            }